

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

void __thiscall
flatbuffers::go::GoGenerator::BuildFieldOfTable
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,size_t offset,string *code_ptr)

{
  IdlNamer *pIVar1;
  Value *type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  ulong *puVar6;
  undefined8 uVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string field_var;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  size_t local_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pIVar1 = &this->namer_;
  local_b8 = offset;
  (*(this->namer_).super_Namer._vptr_Namer[7])(&local_90,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_50,pIVar1,struct_def);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x384700);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_d8.field_2._M_allocated_capacity = *psVar5;
    local_d8.field_2._8_8_ = plVar3[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar5;
    local_d8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_d8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6) {
    local_f8.field_2._M_allocated_capacity = *puVar6;
    local_f8.field_2._8_8_ = plVar3[3];
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *puVar6;
    local_f8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_f8._M_string_length = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (*(pIVar1->super_Namer)._vptr_Namer[6])(&local_b0,pIVar1,field);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    uVar7 = local_f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_a8 + local_f8._M_string_length) {
    uVar8 = 0xf;
    if (local_b0 != local_a0) {
      uVar8 = local_a0[0];
    }
    if (uVar8 < local_a8 + local_f8._M_string_length) goto LAB_002188b3;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_b0,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
  }
  else {
LAB_002188b3:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b0);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar5 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_118.field_2._M_allocated_capacity = *psVar5;
    local_118.field_2._8_8_ = puVar4[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar5;
    local_118._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_118._M_string_length = puVar4[1];
  *puVar4 = psVar5;
  puVar4[1] = 0;
  *(undefined1 *)psVar5 = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
  paVar2 = &local_118.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  local_118._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  std::__cxx11::string::append((char *)&local_118);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  type = &field->value;
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) || (struct_def->fixed != false)) {
    GenTypeGet_abi_cxx11_(&local_118,this,&type->type);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::append((char *)code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  GenMethod_abi_cxx11_(&local_118,this,field);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  else {
    NumToString<unsigned_long>(&local_d8,local_b8);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x375c95);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    puVar6 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_f8.field_2._M_allocated_capacity = *puVar6;
      local_f8.field_2._8_8_ = plVar3[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar6;
      local_f8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_f8._M_string_length = plVar3[1];
    *plVar3 = (long)puVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118.field_2._8_8_ = plVar3[3];
      local_118._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_118._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (((type->type).base_type - BASE_TYPE_UTYPE < 0xc) || (struct_def->fixed != false)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    CastToBaseType(&local_118,this,&type->type,&local_70);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    _Var9._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_00218d79;
  }
  else {
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_f8,"(",&local_90);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118.field_2._8_8_ = plVar3[3];
      local_118._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_118._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    local_70.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
    _Var9._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_00218d79;
  }
  operator_delete(_Var9._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_00218d79:
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::append((char *)code_ptr);
    NumToString<unsigned_long>(&local_f8,local_b8);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x375c8c);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118.field_2._8_8_ = plVar3[3];
      local_118._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_118._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
  }
  else {
    GenConstant_abi_cxx11_(&local_f8,this,field);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x375f8e);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118.field_2._8_8_ = plVar3[3];
      local_118._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar5;
      local_118._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_118._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BuildFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                         const size_t offset, std::string *code_ptr) {
    std::string &code = *code_ptr;
    const std::string field_var = namer_.Variable(field);
    code += "func " + namer_.Type(struct_def) + "Add" + namer_.Function(field);
    code += "(builder *flatbuffers.Builder, ";
    code += field_var + " ";
    if (!IsScalar(field.value.type.base_type) && (!struct_def.fixed)) {
      code += "flatbuffers.UOffsetT";
    } else {
      code += GenTypeGet(field.value.type);
    }
    code += ") {\n\t";
    code += "builder.Prepend";
    code += GenMethod(field);
    if (field.IsScalarOptional()) {
      code += "(";
    } else {
      code += "Slot(" + NumToString(offset) + ", ";
    }
    if (!IsScalar(field.value.type.base_type) && (!struct_def.fixed)) {
      code += "flatbuffers.UOffsetT";
      code += "(" + field_var + ")";
    } else {
      code += CastToBaseType(field.value.type, field_var);
    }
    if (field.IsScalarOptional()) {
      code += ")\n";
      code += "\tbuilder.Slot(" + NumToString(offset);
    } else {
      code += ", " + GenConstant(field);
    }
    code += ")\n";
    code += "}\n";
  }